

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O2

void __thiscall
nestl::impl::vector<int,_nestl::test::allocator_with_state<int>_>::
grow<nestl::has_exceptions::exception_ptr_error>
          (vector<int,_nestl::test::allocator_with_state<int>_> *this,exception_ptr_error *err,
          size_type requiredCapacity)

{
  int *p;
  pointer pvVar1;
  bool bVar2;
  int *output;
  ulong uVar3;
  ulong n;
  deallocation_scoped_guard<int_*,_nestl::test::allocator_with_state<int>_> dStack_38;
  
  uVar3 = (long)this->m_end_of_storage - (long)this->m_start >> 2;
  n = uVar3 * 3 + 3 >> 1;
  if (n <= requiredCapacity) {
    n = requiredCapacity;
  }
  if (n <= uVar3) {
    __assert_fail("newCapacity > capacity()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/vector.hpp"
                  ,0x328,
                  "void nestl::impl::vector<int, nestl::test::allocator_with_state<int>>::grow(OperationError &, size_type) [T = int, Allocator = nestl::test::allocator_with_state<int>, OperationError = nestl::has_exceptions::exception_ptr_error]"
                 );
  }
  if (n <= (ulong)((long)this->m_end_of_storage - (long)this->m_start >> 2)) {
    return;
  }
  output = test::allocator_with_state<int>::allocate<nestl::has_exceptions::exception_ptr_error>
                     (&this->m_allocator,err,n,(void *)0x0);
  bVar2 = has_exceptions::exception_ptr_error::operator_cast_to_bool(err);
  if (!bVar2) {
    dStack_38.m_alloc = &this->m_allocator;
    dStack_38.m_ptr = output;
    dStack_38.m_size = n;
    nestl::detail::uninitialised_copy<nestl::has_exceptions::exception_ptr_error,int*,int*>
              (err,this->m_start,this->m_finish,output);
    bVar2 = has_exceptions::exception_ptr_error::operator_cast_to_bool(err);
    if (!bVar2) {
      p = this->m_start;
      pvVar1 = this->m_finish;
      test::allocator_with_state<int>::deallocate
                (&this->m_allocator,p,(long)this->m_end_of_storage - (long)p >> 2);
      this->m_start = output;
      this->m_finish = (pointer)(((long)pvVar1 - (long)p) + (long)output);
      this->m_end_of_storage = output + n;
      dStack_38.m_ptr = (int *)0x0;
    }
    nestl::detail::deallocation_scoped_guard<int_*,_nestl::test::allocator_with_state<int>_>::
    ~deallocation_scoped_guard(&dStack_38);
  }
  return;
}

Assistant:

void
vector<T, A>::grow(OperationError& err, size_type requiredCapacity) NESTL_NOEXCEPT_SPEC
{
    size_t newCapacity = (((capacity() + 1) * 3) / 2);
    if (newCapacity < requiredCapacity)
    {
        newCapacity = requiredCapacity;
    }

    /// @bug overflow error
    assert(newCapacity > capacity());

    reserve_nothrow(err, newCapacity);
}